

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_null<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  basic_value<toml::type_config> *v;
  region reg;
  allocator<char> local_48a;
  allocator<char> local_489;
  literal local_488;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  region local_3f0;
  location local_388;
  undefined1 local_340 [200];
  source_location local_278;
  region local_200;
  basic_value<toml::type_config> local_198;
  error_info local_d0;
  error_info local_78;
  
  if ((ctx->toml_spec_).ext_null_value == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,
               "toml::parse_null: invalid spec: spec.ext_null_value must be true.",
               (allocator<char> *)&local_488);
    region::region((region *)local_340,loc);
    source_location::source_location(&local_278,(region *)local_340);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"here",&local_48a);
    make_error_info<>((error_info *)&local_3f0,&local_410,&local_278,&local_430);
    err<toml::error_info>((failure<toml::error_info> *)&local_78,(error_info *)&local_3f0);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_78);
    error_info::~error_info(&local_78);
    error_info::~error_info((error_info *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_430);
    source_location::~source_location(&local_278);
    region::~region((region *)local_340);
    std::__cxx11::string::~string((string *)&local_410);
  }
  else {
    local_340._0_8_ = &PTR__scanner_base_00469a58;
    local_340._8_8_ = (long)"Failed getting file size. fd is null" + 0x20;
    local_340._16_8_ = 4;
    literal::scan(&local_3f0,(literal *)local_340,loc);
    if (local_3f0.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"toml::parse_null: invalid null: null must be lowercase. ",
                 &local_48a);
      local_488.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00469a58;
      local_488.value_ = "null";
      local_488.size_ = 4;
      location::location(&local_388,loc);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"",&local_489);
      make_syntax_error<toml::detail::literal>
                ((error_info *)local_340,&local_450,&local_488,&local_388,&local_470);
      err<toml::error_info>((failure<toml::error_info> *)&local_d0,(error_info *)local_340);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_d0);
      error_info::~error_info(&local_d0);
      error_info::~error_info((error_info *)local_340);
      std::__cxx11::string::~string((string *)&local_470);
      location::~location(&local_388);
      std::__cxx11::string::~string((string *)&local_450);
    }
    else {
      region::region(&local_200,&local_3f0);
      basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)local_340,&local_200);
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_198,(toml *)local_340,v);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(success_type *)&local_198);
      basic_value<toml::type_config>::~basic_value(&local_198);
      basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_340);
      region::~region(&local_200);
    }
    region::~region(&local_3f0);
  }
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_null(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    if( ! spec.ext_null_value)
    {
        return err(make_error_info("toml::parse_null: "
            "invalid spec: spec.ext_null_value must be true.",
            source_location(region(loc)), "here"));
    }

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::null_value(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_null: "
            "invalid null: null must be lowercase. ",
            syntax::null_value(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    // ----------------------------------------------------------------------
    // no format info for boolean

    return ok(basic_value<TC>(detail::none_t{}, std::move(reg)));
}